

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O3

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addArgumentsOperands
          (LLVMPointerGraphBuilder *this,Function *F,CallInst *CI,uint index)

{
  long lVar1;
  key_type pVVar2;
  iterator iVar3;
  key_type pVVar4;
  key_type local_38;
  
  if (((byte)F[0x12] & 1) == 0) {
    pVVar4 = *(key_type *)(F + 0x58);
    pVVar2 = pVVar4;
  }
  else {
    llvm::Function::BuildLazyArguments();
    pVVar4 = *(key_type *)(F + 0x58);
    pVVar2 = pVVar4;
    if (((byte)F[0x12] & 1) != 0) {
      llvm::Function::BuildLazyArguments();
      pVVar2 = *(key_type *)(F + 0x58);
    }
  }
  lVar1 = *(long *)(F + 0x60);
  if (pVVar4 != pVVar2 + lVar1 * 0x28) {
    do {
      local_38 = pVVar4;
      iVar3 = std::
              _Hashtable<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Value_*>,_std::hash<const_llvm::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Value_*>,_std::hash<const_llvm::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)(this + 0x188),&local_38);
      if (CI == (CallInst *)0x0) {
        addArgumentOperands(this,F,(PSNode *)
                                   **(undefined8 **)
                                     ((long)iVar3.
                                            super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
                                            ._M_cur + 0x10),index);
      }
      else {
        addArgumentOperands(this,CI,(PSNode *)
                                    **(undefined8 **)
                                      ((long)iVar3.
                                             super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
                                             ._M_cur + 0x10),index);
      }
      pVVar4 = pVVar4 + 0x28;
      index = index + 1;
    } while (pVVar4 != pVVar2 + lVar1 * 0x28);
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addArgumentsOperands(const llvm::Function *F,
                                                   const llvm::CallInst *CI,
                                                   unsigned index) {
    for (auto A = F->arg_begin(), E = F->arg_end(); A != E; ++A, ++index) {
        auto it = nodes_map.find(&*A);
        assert(it != nodes_map.end());
        PSNodesSeq &cur = it->second;

        if (CI) {
            // with func ptr call we know from which
            // call we should take the values
            addArgumentOperands(CI, cur.getSingleNode(), index);
        } else {
            // with regular call just use all calls
            addArgumentOperands(F, cur.getSingleNode(), index);
        }
    }
}